

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_encoder.h
# Opt level: O1

_Bool rc_encode(lzma_range_encoder *rc,uint8_t *out,size_t *out_pos,size_t out_size)

{
  uint64_t *puVar1;
  ushort uVar2;
  size_t sVar3;
  ushort *puVar4;
  ulong uVar5;
  uint uVar6;
  
  if (0x3a < rc->count) {
    __assert_fail("rc->count <= RC_SYMBOLS_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/rangecoder/range_encoder.h"
                  ,0x99,"_Bool rc_encode(lzma_range_encoder *, uint8_t *, size_t *, size_t)");
  }
  if (rc->pos < rc->count) {
    do {
      if (rc->range < 0x1000000) {
        if ((rc->low & 0xffffffffff000000) != 0xff000000) {
          do {
            if (*out_pos == out_size) {
              return true;
            }
            out[*out_pos] = rc->cache + *(char *)((long)&rc->low + 4);
            *out_pos = *out_pos + 1;
            rc->cache = 0xff;
            puVar1 = &rc->cache_size;
            *puVar1 = *puVar1 - 1;
          } while (*puVar1 != 0);
          rc->cache = *(uint8_t *)((long)&rc->low + 3);
        }
        rc->cache_size = rc->cache_size + 1;
        rc->low = (ulong)(uint)((int)rc->low << 8);
        rc->range = rc->range << 8;
      }
      sVar3 = rc->pos;
      switch(rc->symbols[sVar3]) {
      case RC_BIT_0:
        puVar4 = rc->probs[sVar3];
        uVar2 = *puVar4;
        rc->range = (rc->range >> 0xb) * (uint)uVar2;
        *puVar4 = (short)(0x800 - uVar2 >> 5) + uVar2;
        break;
      case RC_BIT_1:
        puVar4 = rc->probs[sVar3];
        uVar2 = *puVar4;
        uVar6 = (rc->range >> 0xb) * (uint)uVar2;
        rc->low = rc->low + (ulong)uVar6;
        rc->range = rc->range - uVar6;
        *puVar4 = uVar2 - (uVar2 >> 5);
        break;
      case RC_DIRECT_0:
        rc->range = rc->range >> 1;
        break;
      case RC_DIRECT_1:
        uVar6 = rc->range >> 1;
        rc->range = uVar6;
        rc->low = rc->low + (ulong)uVar6;
        break;
      case RC_FLUSH:
        rc->range = 0xffffffff;
        do {
          if ((rc->low & 0xffffffffff000000) != 0xff000000) {
            do {
              if (*out_pos == out_size) {
                return true;
              }
              out[*out_pos] = rc->cache + *(char *)((long)&rc->low + 4);
              *out_pos = *out_pos + 1;
              rc->cache = 0xff;
              puVar1 = &rc->cache_size;
              *puVar1 = *puVar1 - 1;
            } while (*puVar1 != 0);
            rc->cache = *(uint8_t *)((long)&rc->low + 3);
          }
          rc->cache_size = rc->cache_size + 1;
          rc->low = (ulong)(uint)((int)rc->low << 8);
          uVar5 = rc->pos + 1;
          rc->pos = uVar5;
        } while (uVar5 < rc->count);
        rc->low = 0;
        rc->cache_size = 1;
        rc->range = 0xffffffff;
        rc->cache = '\0';
        goto LAB_005ea080;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/rangecoder/range_encoder.h"
                      ,0xd3,"_Bool rc_encode(lzma_range_encoder *, uint8_t *, size_t *, size_t)");
      }
      rc->pos = sVar3 + 1;
    } while (sVar3 + 1 < rc->count);
  }
LAB_005ea080:
  rc->count = 0;
  rc->pos = 0;
  return false;
}

Assistant:

static inline bool
rc_encode(lzma_range_encoder *rc,
		uint8_t *out, size_t *out_pos, size_t out_size)
{
	assert(rc->count <= RC_SYMBOLS_MAX);

	while (rc->pos < rc->count) {
		// Normalize
		if (rc->range < RC_TOP_VALUE) {
			if (rc_shift_low(rc, out, out_pos, out_size))
				return true;

			rc->range <<= RC_SHIFT_BITS;
		}

		// Encode a bit
		switch (rc->symbols[rc->pos]) {
		case RC_BIT_0: {
			probability prob = *rc->probs[rc->pos];
			rc->range = (rc->range >> RC_BIT_MODEL_TOTAL_BITS)
					* prob;
			prob += (RC_BIT_MODEL_TOTAL - prob) >> RC_MOVE_BITS;
			*rc->probs[rc->pos] = prob;
			break;
		}

		case RC_BIT_1: {
			probability prob = *rc->probs[rc->pos];
			const uint32_t bound = prob * (rc->range
					>> RC_BIT_MODEL_TOTAL_BITS);
			rc->low += bound;
			rc->range -= bound;
			prob -= prob >> RC_MOVE_BITS;
			*rc->probs[rc->pos] = prob;
			break;
		}

		case RC_DIRECT_0:
			rc->range >>= 1;
			break;

		case RC_DIRECT_1:
			rc->range >>= 1;
			rc->low += rc->range;
			break;

		case RC_FLUSH:
			// Prevent further normalizations.
			rc->range = UINT32_MAX;

			// Flush the last five bytes (see rc_flush()).
			do {
				if (rc_shift_low(rc, out, out_pos, out_size))
					return true;
			} while (++rc->pos < rc->count);

			// Reset the range encoder so we are ready to continue
			// encoding if we weren't finishing the stream.
			rc_reset(rc);
			return false;

		default:
			assert(0);
			break;
		}

		++rc->pos;
	}

	rc->count = 0;
	rc->pos = 0;

	return false;
}